

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

int __thiscall ON_String::Replace(ON_String *this,char utf8_single_byte_c1,char utf8_single_byte_c2)

{
  int iVar1;
  ON_Internal_Empty_aString *pOVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c1);
  iVar5 = 0;
  if (iVar1 != 0) {
    iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c2);
    iVar5 = 0;
    if (iVar1 != 0) {
      pOVar2 = &empty_astring;
      if (this->m_s != (char *)0x0) {
        pOVar2 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      }
      lVar4 = (long)(pOVar2->header).string_length;
      if (lVar4 != 0) {
        iVar5 = 0;
        do {
          pcVar3 = this->m_s;
          if (pcVar3[lVar4 + -1] == utf8_single_byte_c1) {
            if (iVar5 == 0) {
              CopyArray(this);
              pcVar3 = this->m_s;
            }
            pcVar3[lVar4 + -1] = utf8_single_byte_c2;
            iVar5 = iVar5 + 1;
          }
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
    }
  }
  return iVar5;
}

Assistant:

int ON_String::Replace(char utf8_single_byte_c1, char utf8_single_byte_c2)
{
  int count = 0;
  if (ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c1) && ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c2))
  {
    int i = Length();
    while (i--)
    {
      if (utf8_single_byte_c1 == m_s[i])
      {
        if (0 == count)
          CopyArray();
        m_s[i] = utf8_single_byte_c2;
        count++;
      }
    }
  }
  return count;
}